

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<31UL> * __thiscall
mserialize::cx_strcat<1ul,1ul,12ul,1ul,9ul,1ul,5ul,1ul>
          (cx_string<31UL> *__return_storage_ptr__,mserialize *this,cx_string<1UL> *strings,
          cx_string<1UL> *strings_1,cx_string<12UL> *strings_2,cx_string<1UL> *strings_3,
          cx_string<9UL> *strings_4,cx_string<1UL> *strings_5,cx_string<5UL> *strings_6,
          cx_string<1UL> *strings_7)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  char buffer [32];
  ulong auStack_c8 [10];
  long lStack_78;
  mserialize *local_70;
  cx_string<1UL> *local_68;
  cx_string<1UL> *local_60;
  cx_string<12UL> *local_58;
  cx_string<1UL> *local_50;
  cx_string<9UL> *local_48;
  cx_string<1UL> *pcStack_40;
  cx_string<5UL> *local_38;
  undefined8 local_28;
  undefined7 uStack_20;
  undefined1 uStack_19;
  undefined7 local_18;
  undefined1 uStack_11;
  undefined7 uStack_10;
  
  puVar3 = &local_28;
  local_18 = 0;
  uStack_11 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  uStack_19 = 0;
  local_70 = this;
  local_68 = strings;
  local_60 = strings_1;
  local_58 = strings_2;
  local_50 = strings_3;
  local_48 = strings_4;
  pcStack_40 = strings_5;
  local_38 = strings_6;
  lVar1 = 1;
  auStack_c8[1] = 1;
  auStack_c8[2] = 1;
  auStack_c8[3] = 0xc;
  auStack_c8[4] = 1;
  auStack_c8[5] = 9;
  auStack_c8[6] = 1;
  auStack_c8[7] = 5;
  auStack_c8[8] = 1;
  do {
    if (auStack_c8[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)puVar3 + uVar2) = *(undefined1 *)((&lStack_78)[lVar1] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < auStack_c8[lVar1]);
      puVar3 = (undefined8 *)((long)puVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 9);
  __return_storage_ptr__->_data[0x1f] = '\0';
  *(undefined8 *)__return_storage_ptr__->_data = local_28;
  *(ulong *)(__return_storage_ptr__->_data + 8) = CONCAT17(uStack_19,uStack_20);
  *(ulong *)(__return_storage_ptr__->_data + 0xf) = CONCAT71(local_18,uStack_19);
  *(ulong *)(__return_storage_ptr__->_data + 0x17) = CONCAT71(uStack_10,uStack_11);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}